

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifres(bifcxdef *ctx,int argc)

{
  voccxdef *ctx_00;
  long lVar1;
  int in_ESI;
  long in_RDI;
  voccxdef *unaff_retaddr;
  objnum fn;
  voccxdef *vctx;
  int in_stack_00000118;
  objnum in_stack_0000011e;
  runcxdef *in_stack_00000120;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  undefined2 in_stack_ffffffffffffffe6;
  ushort uVar2;
  
  ctx_00 = *(voccxdef **)(*(long *)(in_RDI + 8) + 0x70);
  if (in_ESI == 2) {
    lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) != '\n') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign((runcxdef *)
              CONCAT26(in_stack_ffffffffffffffe6,
                       CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)),
              in_stack_ffffffffffffffdc);
    }
    uVar2 = *(ushort *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    in_stack_ffffffffffffffe0 = (uint)uVar2;
  }
  else {
    uVar2 = 0xffff;
  }
  objulose(ctx_00->voccxundo);
  vocrevert(unaff_retaddr);
  vocdmnclr(ctx_00);
  ctx_00->voccxme = ctx_00->voccxme_init;
  if (ctx_00->voccxpreinit != 0xffff) {
    runfn(in_stack_00000120,in_stack_0000011e,in_stack_00000118);
  }
  if (uVar2 != 0xffff) {
    runfn(in_stack_00000120,in_stack_0000011e,in_stack_00000118);
  }
  errsigf((errcxdef *)CONCAT26(uVar2,CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)),
          (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
}

Assistant:

void bifres(bifcxdef *ctx, int argc)
{
    voccxdef *vctx = ctx->bifcxrun->runcxvoc;
    objnum    fn;

    if (argc == 2)
        fn = runpopfn(ctx->bifcxrun);            /* get function if present */
    else
    {
        bifcntargs(ctx, 0, argc);        /* check for proper argument count */
        fn = MCMONINV;                         /* no function was specified */
    }

    objulose(vctx->voccxundo);                /* blow away all undo records */
    vocrevert(vctx);                /* revert all objects to original state */
    vocdmnclr(vctx);                   /* clear out fuses/deamons/notifiers */

    /* restore the original "Me" object */
    vctx->voccxme = vctx->voccxme_init;

    /* call preinit if necessary (call it before invoking the user callback) */
    if (vctx->voccxpreinit != MCMONINV)
        runfn(ctx->bifcxrun, vctx->voccxpreinit, 0);

    /*
     *   If a restart function was provided, call it.  Note that we left
     *   the argument for the function on the stack, so there's no need to
     *   re-push it!  
     */
    if (fn != MCMONINV) runfn(ctx->bifcxrun, fn, 1);

    /* restart the game */
    errsig(ctx->bifcxerr, ERR_RUNRESTART);
}